

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void xmlBufferSetAllocationScheme(xmlBufferPtr buf,xmlBufferAllocationScheme scheme)

{
  if ((((buf != (xmlBufferPtr)0x0) &&
       ((buf->alloc & ~XML_BUFFER_ALLOC_EXACT) != XML_BUFFER_ALLOC_IMMUTABLE)) &&
      (scheme < XML_BUFFER_ALLOC_BOUNDED)) && (scheme != XML_BUFFER_ALLOC_IO)) {
    buf->alloc = scheme;
  }
  return;
}

Assistant:

void
xmlBufferSetAllocationScheme(xmlBufferPtr buf,
                             xmlBufferAllocationScheme scheme) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufferSetAllocationScheme: buf == NULL\n");
#endif
        return;
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        (buf->alloc == XML_BUFFER_ALLOC_IO)) return;
    if ((scheme == XML_BUFFER_ALLOC_DOUBLEIT) ||
        (scheme == XML_BUFFER_ALLOC_EXACT) ||
        (scheme == XML_BUFFER_ALLOC_HYBRID) ||
        (scheme == XML_BUFFER_ALLOC_IMMUTABLE))
	buf->alloc = scheme;
}